

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandFrames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  uint fInitial;
  char *pcVar5;
  uint local_40;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fInitial = 0;
  Extra_UtilGetoptReset();
  local_40 = 5;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Fivh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType == ABC_NTK_STRASH) {
            pAVar2 = Abc_NtkFrames(pAVar2,local_40,fInitial,fVerbose);
          }
          else {
            pNtk = Abc_NtkStrash(pAVar2,0,0,0);
            pAVar2 = Abc_NtkFrames(pNtk,local_40,fInitial,fVerbose);
            Abc_NtkDelete(pNtk);
          }
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "Unrolling the network has failed.\n";
        }
        iVar4 = -1;
        goto LAB_00259f22;
      }
      if (iVar1 != 0x69) break;
      fInitial = fInitial ^ 1;
    }
    if (iVar1 != 0x46) goto LAB_00259e92;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)local_40 < 1) {
LAB_00259e92:
      Abc_Print(-2,"usage: frames [-F <num>] [-ivh]\n");
      Abc_Print(-2,"\t           unrolls the network for a number of time frames\n");
      Abc_Print(-2,"\t-F <num> : the number of frames to unroll [default = %d]\n",(ulong)local_40);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fInitial == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-i       : toggles initializing the first frame [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles outputting verbose information [default = %s]\n",pcVar5);
      pcVar3 = "\t-h       : print the command usage\n";
      iVar4 = -2;
LAB_00259f22:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_00259e92;
}

Assistant:

int Abc_CommandFrames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp, * pNtkRes;
    int nFrames;
    int fInitial;
    int fVerbose;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nFrames  = 5;
    fInitial = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames <= 0 )
                goto usage;
            break;
        case 'i':
            fInitial ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes  = Abc_NtkFrames( pNtkTemp, nFrames, fInitial, fVerbose );
        Abc_NtkDelete( pNtkTemp );
    }
    else
        pNtkRes  = Abc_NtkFrames( pNtk, nFrames, fInitial, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Unrolling the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: frames [-F <num>] [-ivh]\n" );
    Abc_Print( -2, "\t           unrolls the network for a number of time frames\n" );
    Abc_Print( -2, "\t-F <num> : the number of frames to unroll [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-i       : toggles initializing the first frame [default = %s]\n", fInitial? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles outputting verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}